

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::DiagStackFrame::GetThisFromFrame
          (DiagStackFrame *this,IDiagObjectAddress **ppOutAddress,
          IDiagObjectModelWalkerBase *localsWalker)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  ModuleID moduleID;
  undefined4 extraout_var;
  JavascriptFunction *this_00;
  FunctionBody *this_01;
  ParseableFunctionInfo *pPVar5;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  ReferencedArenaAdapter *pRVar8;
  IDiagObjectAddress *pIVar9;
  undefined4 extraout_var_02;
  GlobalObject *this_02;
  undefined4 extraout_var_03;
  ArenaAllocator *alloc;
  ModuleRoot *local_40;
  Var varThis;
  bool unused;
  ScriptContext *scriptContext;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*this->_vptr_DiagStackFrame[10])();
  scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->_vptr_DiagStackFrame[2])(this);
  this_00 = (JavascriptFunction *)CONCAT44(extraout_var_00,iVar3);
  BVar4 = JavascriptFunction::IsScriptFunction(this_00);
  if (BVar4 == 0) {
    moduleID = 0;
  }
  else {
    this_01 = JavascriptFunction::GetFunctionBody(this_00);
    moduleID = FunctionBody::GetModuleID(this_01);
  }
  local_40 = (ModuleRoot *)
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
  BVar4 = JavascriptFunction::IsLambda(this_00);
  if (BVar4 == 0) {
    JavascriptStackWalker::GetThis(&local_40,moduleID,this_00,scriptContext);
  }
  else {
    pPVar5 = JavascriptFunction::GetParseableFunctionInfo(this_00);
    pFVar7 = (pPVar5->super_FunctionProxy).functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x514,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_008c42c0;
      *puVar6 = 0;
      pFVar7 = (pPVar5->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar7->functionBodyImpl).ptr != pPVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x515,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) {
LAB_008c42c0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
      pFVar7 = (pPVar5->super_FunctionProxy).functionInfo.ptr;
    }
    if ((pFVar7->attributes & CapturesThis) == None) {
      return (Var)0x0;
    }
    if (localsWalker == (IDiagObjectModelWalkerBase *)0x0) {
      pRVar8 = DebugManager::GetDiagnosticArena(scriptContext->threadContext->debugManager);
      alloc = (ArenaAllocator *)0x0;
      if (pRVar8->deleteFlag == false) {
        alloc = pRVar8->arena;
      }
      localsWalker = (IDiagObjectModelWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
      LocalsWalker::LocalsWalker((LocalsWalker *)localsWalker,this,6);
    }
    varThis._7_1_ = 0;
    iVar3 = (*(((LocalsWalker *)localsWalker)->super_IDiagObjectModelWalkerBase).
              _vptr_IDiagObjectModelWalkerBase[3])(localsWalker,0x2d5);
    pIVar9 = (IDiagObjectAddress *)CONCAT44(extraout_var_01,iVar3);
    if (ppOutAddress != (IDiagObjectAddress **)0x0) {
      *ppOutAddress = pIVar9;
    }
    if (pIVar9 == (IDiagObjectAddress *)0x0) {
      if (moduleID == 0) {
        this_02 = JavascriptOperators::OP_LdRoot(scriptContext);
        local_40 = (ModuleRoot *)GlobalObject::ToThis(this_02);
      }
      else {
        local_40 = JavascriptOperators::GetModuleRoot(moduleID,scriptContext);
      }
    }
    else {
      iVar3 = (*pIVar9->_vptr_IDiagObjectAddress[2])(pIVar9,0);
      local_40 = (ModuleRoot *)CONCAT44(extraout_var_02,iVar3);
    }
  }
  iVar3 = (*this->_vptr_DiagStackFrame[2])(this);
  BVar4 = JavascriptFunction::IsStrictMode((JavascriptFunction *)CONCAT44(extraout_var_03,iVar3));
  if (BVar4 == 0) {
    GlobalObject::UpdateThisForEval(&local_40,moduleID,scriptContext);
  }
  return local_40;
}

Assistant:

Js::Var DiagStackFrame::GetThisFromFrame(Js::IDiagObjectAddress ** ppOutAddress, Js::IDiagObjectModelWalkerBase * localsWalker)
    {
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        Js::JavascriptFunction* scopeFunction = this->GetJavascriptFunction();
        Js::ModuleID moduleId = scopeFunction->IsScriptFunction() ? scopeFunction->GetFunctionBody()->GetModuleID() : 0;
        Js::Var varThis = scriptContext->GetLibrary()->GetNull();

        if (!scopeFunction->IsLambda())
        {
            Js::JavascriptStackWalker::GetThis(&varThis, moduleId, scopeFunction, scriptContext);
        }
        else
        {
            if (!scopeFunction->GetParseableFunctionInfo()->GetCapturesThis())
            {
                return nullptr;
            }
            else
            {
                // Emulate Js::JavascriptOperators::OP_GetThisScoped using a locals walker and assigning moduleId object if not found by locals walker
                if (localsWalker == nullptr)
                {
                    ArenaAllocator *arena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena()->Arena();
                    localsWalker = Anew(arena, Js::LocalsWalker, this, Js::FrameWalkerFlags::FW_EnumWithScopeAlso | Js::FrameWalkerFlags::FW_AllowLexicalThis);
                }

                bool unused = false;
                Js::IDiagObjectAddress* address = localsWalker->FindPropertyAddress(Js::PropertyIds::_this, unused);

                if (ppOutAddress != nullptr)
                {
                    *ppOutAddress = address;
                }

                if (address != nullptr)
                {
                    varThis = address->GetValue(FALSE);
                }
                else if (moduleId == kmodGlobal)
                {
                    varThis = Js::JavascriptOperators::OP_LdRoot(scriptContext)->ToThis();
                }
                else
                {
                    varThis = (Var)Js::JavascriptOperators::GetModuleRoot(moduleId, scriptContext);
                }
            }
        }

        if (!this->IsStrictMode())
        {
            Js::GlobalObject::UpdateThisForEval(varThis, moduleId, scriptContext);
        }
        return varThis;
    }